

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

void do_channels(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  long in_RDI;
  __type_conflict2 _Var2;
  char buf [4608];
  anon_class_1_0_00000001 sendToChar;
  CHAR_DATA *in_stack_ffffffffffffed98;
  CHAR_DATA *in_stack_ffffffffffffeda0;
  ulong uVar3;
  CHAR_DATA *in_stack_ffffffffffffeda8;
  CHAR_DATA *ch_00;
  anon_class_1_0_00000001 *in_stack_ffffffffffffedb0;
  char *txt;
  char local_1218 [4624];
  long local_8;
  
  local_8 = in_RDI;
  send_to_char((char *)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
  send_to_char((char *)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
  send_to_char((char *)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
  std::pow<int,int>(0,0x522af6);
  do_channels::anon_class_1_0_00000001::operator()
            (in_stack_ffffffffffffedb0,SUB81((ulong)in_stack_ffffffffffffeda8 >> 0x38,0),
             in_stack_ffffffffffffeda0);
  send_to_char((char *)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
  std::pow<int,int>(0,0x522b5e);
  do_channels::anon_class_1_0_00000001::operator()
            (in_stack_ffffffffffffedb0,SUB81((ulong)in_stack_ffffffffffffeda8 >> 0x38,0),
             in_stack_ffffffffffffeda0);
  bVar1 = is_immortal(in_stack_ffffffffffffed98);
  if (bVar1) {
    send_to_char((char *)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
    std::pow<int,int>(0,0x522bd6);
    do_channels::anon_class_1_0_00000001::operator()
              (in_stack_ffffffffffffedb0,SUB81((ulong)in_stack_ffffffffffffeda8 >> 0x38,0),
               in_stack_ffffffffffffeda0);
  }
  send_to_char((char *)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
  std::pow<int,int>(0,0x522c3e);
  do_channels::anon_class_1_0_00000001::operator()
            (in_stack_ffffffffffffedb0,SUB81((ulong)in_stack_ffffffffffffeda8 >> 0x38,0),
             in_stack_ffffffffffffeda0);
  send_to_char((char *)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
  std::pow<int,int>(0,0x522ca3);
  do_channels::anon_class_1_0_00000001::operator()
            (in_stack_ffffffffffffedb0,SUB81((ulong)in_stack_ffffffffffffeda8 >> 0x38,0),
             in_stack_ffffffffffffeda0);
  uVar3 = *(ulong *)(local_8 + 400);
  _Var2 = std::pow<int,int>(0,0x522cf5);
  if ((uVar3 & (long)_Var2) != 0) {
    send_to_char((char *)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
  }
  if (*(int *)(local_8 + 0x140) != 0x14) {
    if (*(int *)(local_8 + 0x140) == 0) {
      send_to_char((char *)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
    }
    else {
      sprintf(local_1218,"You display %d lines of scroll.\n\r",
              (ulong)(*(int *)(local_8 + 0x140) + 2));
      send_to_char((char *)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
    }
  }
  txt = *(char **)(local_8 + 400);
  _Var2 = std::pow<int,int>(0,0x522daf);
  if (((ulong)txt & (long)_Var2) != 0) {
    send_to_char(txt,in_stack_ffffffffffffeda8);
  }
  ch_00 = *(CHAR_DATA **)(local_8 + 400);
  _Var2 = std::pow<int,int>(0,0x522df9);
  if (((ulong)ch_00 & (long)_Var2) != 0) {
    send_to_char(txt,ch_00);
  }
  uVar3 = *(ulong *)(local_8 + 400);
  _Var2 = std::pow<int,int>(0,0x522e43);
  if ((uVar3 & (long)_Var2) != 0) {
    send_to_char(txt,ch_00);
  }
  return;
}

Assistant:

void do_channels(CHAR_DATA *ch, char *argument)
{
	/* lists all channels and their status */
	send_to_char("   channel     status\n\r", ch);
	send_to_char("---------------------\n\r", ch);

	auto sendToChar = [](bool isSet, CHAR_DATA *ch) {
		auto txt = isSet ? "ON\n\r" : "OFF\n\r";
		send_to_char(txt, ch);
	}